

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::ProgressEndEvent>::copyConstruct
          (BasicTypeInfo<dap::ProgressEndEvent> *this,void *dst,void *src)

{
  void *src_local;
  void *dst_local;
  BasicTypeInfo<dap::ProgressEndEvent> *this_local;
  
  ProgressEndEvent::ProgressEndEvent((ProgressEndEvent *)dst,(ProgressEndEvent *)src);
  return;
}

Assistant:

inline void copyConstruct(void* dst, const void* src) const override {
    new (dst) T(*reinterpret_cast<const T*>(src));
  }